

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nesintf.c
# Opt level: O2

void nes_stream_update_nsfplay(void *chip,UINT32 samples,DEV_SMPL **outputs)

{
  ulong uVar1;
  INT32 Buffer [4];
  int local_48;
  int local_44;
  int local_40;
  int local_3c;
  
  for (uVar1 = 0; samples != uVar1; uVar1 = uVar1 + 1) {
    NES_APU_np_Render(*(void **)((long)chip + 8),&local_48);
    NES_DMC_np_Render(*(void **)((long)chip + 0x10),&local_40);
    (*outputs)[uVar1] = local_40 + local_48;
    outputs[1][uVar1] = local_3c + local_44;
  }
  if (*(void **)((long)chip + 0x18) != (void *)0x0) {
    nes_render_fds(*(void **)((long)chip + 0x18),samples,outputs);
  }
  return;
}

Assistant:

static void nes_stream_update_nsfplay(void* chip, UINT32 samples, DEV_SMPL** outputs)
{
	NESAPU_INF* info = (NESAPU_INF*)chip;
	UINT32 CurSmpl;
	INT32 Buffer[4];
	
	for (CurSmpl = 0; CurSmpl < samples; CurSmpl ++)
	{
		NES_APU_np_Render(info->chip_apu, &Buffer[0]);
		NES_DMC_np_Render(info->chip_dmc, &Buffer[2]);
		outputs[0][CurSmpl] = Buffer[0] + Buffer[2];
		outputs[1][CurSmpl] = Buffer[1] + Buffer[3];
	}
	
#ifdef EC_NES_NSFP_FDS
	if (info->chip_fds != NULL)
		nes_render_fds(info->chip_fds, samples, outputs);
#endif
	
	return;
}